

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_v_predictor_16x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint3 uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar34;
  short sVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  short sVar38;
  short sVar40;
  undefined1 auVar39 [16];
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  int5 iVar45;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  undefined1 auVar71 [16];
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  undefined1 in_XMM6 [16];
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar48 [16];
  
  auVar19 = pshuflw(ZEXT116(left_column[3]),ZEXT116(left_column[3]),0);
  auVar35._0_2_ = auVar19._0_2_;
  sVar34 = auVar19._2_2_;
  auVar35._2_2_ = sVar34 * 0x6b;
  auVar35._4_2_ = auVar35._0_2_ * 0xab;
  auVar35._6_2_ = sVar34 * 0xc0;
  auVar35._8_2_ = auVar35._0_2_ * 0x100;
  auVar35._10_2_ = sVar34 * 0x100;
  auVar35._12_2_ = auVar35._0_2_ * 0x100;
  auVar35._14_2_ = sVar34 * 0x100;
  auVar19 = *(undefined1 (*) [16])top_row;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar19._0_13_;
  auVar4[0xe] = auVar19[7];
  auVar5[0xc] = auVar19[6];
  auVar5._0_12_ = auVar19._0_12_;
  auVar5._13_2_ = auVar4._13_2_;
  auVar6[0xb] = 0;
  auVar6._0_11_ = auVar19._0_11_;
  auVar6._12_3_ = auVar5._12_3_;
  auVar7[10] = auVar19[5];
  auVar7._0_10_ = auVar19._0_10_;
  auVar7._11_4_ = auVar6._11_4_;
  auVar8[9] = 0;
  auVar8._0_9_ = auVar19._0_9_;
  auVar8._10_5_ = auVar7._10_5_;
  auVar9[8] = auVar19[4];
  auVar9._0_8_ = auVar19._0_8_;
  auVar9._9_6_ = auVar8._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar9._8_7_;
  Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),auVar19[3]);
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var11;
  auVar12._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar12[0] = auVar19[2];
  auVar15._11_4_ = 0;
  auVar15._0_11_ = auVar12;
  auVar13._1_12_ = SUB1512(auVar15 << 0x20,3);
  auVar13[0] = auVar19[1];
  auVar20._0_2_ = CONCAT11(0,auVar19[0]);
  auVar20._2_13_ = auVar13;
  auVar20[0xf] = 0;
  auVar25._0_2_ = CONCAT11(0,auVar19[8]);
  bVar27 = auVar19[9];
  auVar25[2] = bVar27;
  auVar25[3] = 0;
  bVar28 = auVar19[10];
  auVar25[4] = bVar28;
  auVar25[5] = 0;
  bVar29 = auVar19[0xb];
  auVar25[6] = bVar29;
  auVar25[7] = 0;
  bVar30 = auVar19[0xc];
  auVar25[8] = bVar30;
  auVar25[9] = 0;
  bVar31 = auVar19[0xd];
  auVar25[10] = bVar31;
  auVar25[0xb] = 0;
  bVar32 = auVar19[0xe];
  auVar25[0xc] = bVar32;
  auVar25[0xd] = 0;
  bVar33 = auVar19[0xf];
  auVar25[0xe] = bVar33;
  auVar25[0xf] = 0;
  auVar16[10] = 0;
  auVar16._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar16[0xb] = auVar19[5];
  auVar17[9] = auVar19[4];
  auVar17._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar17._10_2_ = auVar16._10_2_;
  auVar18._9_3_ = auVar17._9_3_;
  auVar18._0_9_ = (unkuint9)0;
  auVar71 = ZEXT516(CONCAT41(auVar18._8_4_,auVar19[3])) << 0x38;
  auVar36._1_10_ = auVar71._6_10_;
  auVar36[0] = auVar19[2];
  auVar36._11_5_ = 0;
  auVar26._1_12_ = SUB1612(auVar36 << 0x28,4);
  auVar26[0] = auVar19[1];
  auVar26._13_3_ = 0;
  sVar34 = auVar13._0_2_;
  sVar37 = auVar12._0_2_;
  sVar21 = (short)Var11;
  sVar22 = auVar9._8_2_;
  sVar23 = auVar7._10_2_;
  sVar24 = auVar5._12_2_;
  uVar43 = auVar4._13_2_ >> 8;
  uVar3 = CONCAT12(bVar27,(ushort)auVar19[8]);
  iVar45 = (uint5)uVar3 << 8;
  auVar46._0_10_ = CONCAT19(bVar30,(unkuint9)bVar29 << 0x38);
  auVar46[10] = 0;
  auVar46[0xb] = bVar31;
  auVar47[0xc] = 0;
  auVar47._0_12_ = auVar46;
  auVar47[0xd] = bVar32;
  auVar48[0xe] = 0;
  auVar48._0_14_ = auVar47;
  auVar48[0xf] = bVar33;
  auVar39 = pshuflw(auVar19,auVar35,0);
  sVar38 = auVar39._0_2_ + 0x80;
  sVar40 = auVar39._2_2_ + 0x80;
  uVar44 = (ushort)bVar27;
  uVar51 = (ushort)bVar28;
  uVar54 = (ushort)bVar29;
  uVar57 = (ushort)bVar30;
  uVar60 = (ushort)bVar31;
  uVar63 = (ushort)bVar32;
  uVar66 = (ushort)bVar33;
  uVar69 = ((ushort)auVar19[0] * 0x100 - auVar20._0_2_) + sVar38;
  uVar72 = (SUB162(auVar26 << 0x18,2) - sVar34) + sVar40;
  uVar74 = (SUB162(auVar36 << 0x28,4) - sVar37) + sVar38;
  uVar76 = (auVar71._6_2_ - sVar21) + sVar40;
  uVar78 = (auVar18._8_2_ - sVar22) + sVar38;
  uVar80 = (auVar16._10_2_ - sVar23) + sVar40;
  uVar70 = uVar69 >> 8;
  uVar73 = uVar72 >> 8;
  uVar75 = uVar74 >> 8;
  uVar77 = uVar76 >> 8;
  uVar79 = uVar78 >> 8;
  uVar81 = uVar80 >> 8;
  uVar82 = (ushort)(sVar38 - sVar24) >> 8;
  uVar83 = (ushort)(sVar40 - uVar43) >> 8;
  uVar41 = ((short)iVar45 - auVar25._0_2_) + sVar38;
  uVar49 = ((short)(uVar3 >> 8) - uVar44) + sVar40;
  uVar52 = ((short)(CONCAT15(bVar28,iVar45) >> 0x20) - uVar51) + sVar38;
  uVar55 = ((short)(((ulong)bVar29 << 0x38) >> 0x30) - uVar54) + sVar40;
  uVar58 = ((short)(auVar46._0_10_ >> 0x40) - uVar57) + sVar38;
  uVar61 = (auVar46._10_2_ - uVar60) + sVar40;
  uVar64 = (auVar47._12_2_ - uVar63) + sVar38;
  uVar67 = (auVar48._14_2_ - uVar66) + sVar40;
  uVar42 = uVar41 >> 8;
  uVar50 = uVar49 >> 8;
  uVar53 = uVar52 >> 8;
  uVar56 = uVar55 >> 8;
  uVar59 = uVar58 >> 8;
  uVar62 = uVar61 >> 8;
  uVar65 = uVar64 >> 8;
  uVar68 = uVar67 >> 8;
  *dst = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
  dst[1] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
  dst[2] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
  dst[3] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
  dst[4] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
  dst[5] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
  dst[6] = (uVar82 != 0) * (uVar82 < 0x100) * (char)((ushort)(sVar38 - sVar24) >> 8) -
           (0xff < uVar82);
  dst[7] = (uVar83 != 0) * (uVar83 < 0x100) * (char)((ushort)(sVar40 - uVar43) >> 8) -
           (0xff < uVar83);
  dst[8] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
  dst[9] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
  dst[10] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  dst[0xb] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
  dst[0xc] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  dst[0xd] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
  dst[0xe] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  dst[0xf] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
  auVar19 = pshuflw(in_XMM6,auVar35,0x55);
  sVar38 = auVar19._0_2_ + 0x80;
  sVar40 = auVar19._2_2_ + 0x80;
  auVar19._0_4_ = CONCAT22(sVar40,sVar38);
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  uVar69 = auVar20._0_2_ * 0x95 + sVar38;
  uVar72 = sVar34 * 0x95 + sVar40;
  uVar74 = sVar37 * 0x95 + sVar38;
  uVar76 = sVar21 * 0x95 + sVar40;
  uVar78 = sVar22 * 0x95 + sVar38;
  uVar80 = sVar23 * 0x95 + sVar40;
  uVar82 = sVar24 * 0x95 + sVar38;
  uVar84 = uVar43 * 0x95 + sVar40;
  uVar70 = uVar69 >> 8;
  uVar73 = uVar72 >> 8;
  uVar75 = uVar74 >> 8;
  uVar77 = uVar76 >> 8;
  uVar79 = uVar78 >> 8;
  uVar81 = uVar80 >> 8;
  uVar83 = uVar82 >> 8;
  uVar85 = uVar84 >> 8;
  uVar41 = auVar25._0_2_ * 0x95 + sVar38;
  uVar49 = uVar44 * 0x95 + sVar40;
  uVar52 = uVar51 * 0x95 + sVar38;
  uVar55 = uVar54 * 0x95 + sVar40;
  uVar58 = uVar57 * 0x95 + sVar38;
  uVar61 = uVar60 * 0x95 + sVar40;
  uVar64 = uVar63 * 0x95 + sVar38;
  uVar67 = uVar66 * 0x95 + sVar40;
  uVar42 = uVar41 >> 8;
  uVar50 = uVar49 >> 8;
  uVar53 = uVar52 >> 8;
  uVar56 = uVar55 >> 8;
  uVar59 = uVar58 >> 8;
  uVar62 = uVar61 >> 8;
  uVar65 = uVar64 >> 8;
  uVar68 = uVar67 >> 8;
  puVar1 = dst + stride;
  *puVar1 = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
  puVar1[1] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
  puVar1[2] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
  puVar1[3] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
  puVar1[4] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
  puVar1[5] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
  puVar1[6] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
  puVar1[7] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
  puVar1[8] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
  puVar1[9] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
  puVar1[10] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  puVar1[0xb] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
  puVar1[0xc] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  puVar1[0xd] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
  puVar1[0xe] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  puVar1[0xf] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
  puVar1 = dst + stride * 3;
  auVar19 = pshuflw(auVar19,auVar35,0xaa);
  sVar38 = auVar19._0_2_ + 0x80;
  sVar40 = auVar19._2_2_ + 0x80;
  uVar58 = auVar20._0_2_ * 0x55 + sVar38;
  uVar61 = sVar34 * 0x55 + sVar40;
  uVar64 = sVar37 * 0x55 + sVar38;
  uVar67 = sVar21 * 0x55 + sVar40;
  uVar69 = sVar22 * 0x55 + sVar38;
  uVar72 = sVar23 * 0x55 + sVar40;
  uVar74 = sVar24 * 0x55 + sVar38;
  uVar76 = uVar43 * 0x55 + sVar40;
  uVar59 = uVar58 >> 8;
  uVar62 = uVar61 >> 8;
  uVar65 = uVar64 >> 8;
  uVar68 = uVar67 >> 8;
  uVar70 = uVar69 >> 8;
  uVar73 = uVar72 >> 8;
  uVar75 = uVar74 >> 8;
  uVar77 = uVar76 >> 8;
  uVar43 = auVar25._0_2_ * 0x55 + sVar38;
  uVar41 = uVar44 * 0x55 + sVar40;
  uVar42 = uVar51 * 0x55 + sVar38;
  uVar49 = uVar54 * 0x55 + sVar40;
  uVar50 = uVar57 * 0x55 + sVar38;
  uVar52 = uVar60 * 0x55 + sVar40;
  uVar53 = uVar63 * 0x55 + sVar38;
  uVar55 = uVar66 * 0x55 + sVar40;
  uVar44 = uVar43 >> 8;
  uVar51 = uVar41 >> 8;
  uVar54 = uVar42 >> 8;
  uVar57 = uVar49 >> 8;
  uVar60 = uVar50 >> 8;
  uVar63 = uVar52 >> 8;
  uVar66 = uVar53 >> 8;
  uVar56 = uVar55 >> 8;
  puVar2 = dst + stride * 2;
  *puVar2 = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  puVar2[1] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
  puVar2[2] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  puVar2[3] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
  puVar2[4] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
  puVar2[5] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
  puVar2[6] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
  puVar2[7] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
  puVar2[8] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
  puVar2[9] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar51);
  puVar2[10] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar54);
  puVar2[0xb] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar57);
  puVar2[0xc] = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar60);
  puVar2[0xd] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar63);
  puVar2[0xe] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar66);
  puVar2[0xf] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
  auVar19 = psllw(auVar20,6);
  auVar26 = psllw(auVar25,6);
  auVar36 = pshuflw(auVar35,auVar35,0xff);
  sVar34 = auVar36._0_2_ + 0x80;
  sVar37 = auVar36._2_2_ + 0x80;
  uVar43 = auVar19._0_2_ + sVar34;
  uVar51 = auVar19._2_2_ + sVar37;
  uVar57 = auVar19._4_2_ + sVar34;
  uVar63 = auVar19._6_2_ + sVar37;
  uVar41 = auVar19._8_2_ + sVar34;
  uVar49 = auVar19._10_2_ + sVar37;
  uVar52 = auVar19._12_2_ + sVar34;
  uVar55 = auVar19._14_2_ + sVar37;
  uVar44 = uVar43 >> 8;
  uVar54 = uVar51 >> 8;
  uVar60 = uVar57 >> 8;
  uVar66 = uVar63 >> 8;
  uVar42 = uVar41 >> 8;
  uVar50 = uVar49 >> 8;
  uVar53 = uVar52 >> 8;
  uVar56 = uVar55 >> 8;
  uVar58 = auVar26._0_2_ + sVar34;
  uVar61 = auVar26._2_2_ + sVar37;
  uVar64 = auVar26._4_2_ + sVar34;
  uVar67 = auVar26._6_2_ + sVar37;
  uVar69 = auVar26._8_2_ + sVar34;
  uVar72 = auVar26._10_2_ + sVar37;
  uVar74 = auVar26._12_2_ + sVar34;
  uVar76 = auVar26._14_2_ + sVar37;
  uVar59 = uVar58 >> 8;
  uVar62 = uVar61 >> 8;
  uVar65 = uVar64 >> 8;
  uVar68 = uVar67 >> 8;
  uVar70 = uVar69 >> 8;
  uVar73 = uVar72 >> 8;
  uVar75 = uVar74 >> 8;
  uVar77 = uVar76 >> 8;
  *puVar1 = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
  puVar1[1] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar54);
  puVar1[2] = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar60);
  puVar1[3] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar66);
  puVar1[4] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
  puVar1[5] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
  puVar1[6] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  puVar1[7] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
  puVar1[8] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  puVar1[9] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
  puVar1[10] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  puVar1[0xb] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
  puVar1[0xc] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
  puVar1[0xd] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
  puVar1[0xe] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
  puVar1[0xf] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
  return;
}

Assistant:

void aom_smooth_v_predictor_16x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[3]);
  const __m128i weights = cvtepu8_epi16(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = cvtepu8_epi16(_mm_srli_si128(top, 8));

  __m128i y_select = _mm_set1_epi32(0x01000100);
  __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
  __m128i scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
}